

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O1

void __thiscall QList<QPrinterInfo>::reserve(QList<QPrinterInfo> *this,qsizetype asize)

{
  ArrayOptions *pAVar1;
  QPrinterInfo *pQVar2;
  Data *pDVar3;
  long lVar4;
  qsizetype qVar5;
  QPrinterInfo *pQVar6;
  QPrinterInfo *data;
  QPrinterInfo *other;
  long in_FS_OFFSET;
  QArrayData *d;
  QArrayDataPointer<QPrinterInfo> local_48;
  QArrayData *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = (this->d).d;
  if ((pDVar3 != (Data *)0x0) &&
     (asize <= (pDVar3->super_QArrayData).alloc -
               ((long)((long)(this->d).ptr -
                      ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0))
               >> 3))) {
    if (((pDVar3->super_QArrayData).flags.super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
         super_QFlagsStorage<QArrayData::ArrayOption>.i & 1) != 0) goto LAB_001389a6;
    if ((pDVar3 != (Data *)0x0) &&
       ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 1)) {
      pAVar1 = &(pDVar3->super_QArrayData).flags;
      *(byte *)&(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                super_QFlagsStorage<QArrayData::ArrayOption>.i =
           (byte)(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                 super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
      goto LAB_001389a6;
    }
  }
  local_48.size = -0x5555555555555556;
  local_48.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_48.ptr = (QPrinterInfo *)0xaaaaaaaaaaaaaaaa;
  lVar4 = (this->d).size;
  if (asize < lVar4) {
    asize = lVar4;
  }
  local_30 = (QArrayData *)0xaaaaaaaaaaaaaaaa;
  pQVar6 = (QPrinterInfo *)QArrayData::allocate(&local_30,8,0x10,asize,KeepSize);
  local_48.d = (Data *)local_30;
  local_48.size = 0;
  lVar4 = (this->d).size;
  local_48.ptr = pQVar6;
  if (0 < lVar4) {
    other = (this->d).ptr;
    pQVar2 = other + lVar4;
    do {
      QPrinterInfo::QPrinterInfo(pQVar6 + local_48.size,other);
      other = other + 1;
      local_48.size = local_48.size + 1;
    } while (other < pQVar2);
  }
  if (&(local_48.d)->super_QArrayData != (QArrayData *)0x0) {
    *(byte *)&(((ArrayOptions *)((long)local_48.d + 4))->
              super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
              super_QFlagsStorage<QArrayData::ArrayOption>.i =
         (byte)(((ArrayOptions *)((long)local_48.d + 4))->
               super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
               super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
  }
  pDVar3 = (this->d).d;
  pQVar6 = (this->d).ptr;
  (this->d).d = local_48.d;
  (this->d).ptr = local_48.ptr;
  qVar5 = (this->d).size;
  (this->d).size = local_48.size;
  local_48.d = pDVar3;
  local_48.ptr = pQVar6;
  local_48.size = qVar5;
  QArrayDataPointer<QPrinterInfo>::~QArrayDataPointer(&local_48);
LAB_001389a6:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QList<T>::reserve(qsizetype asize)
{
    // capacity() == 0 for immutable data, so this will force a detaching below
    if (asize <= capacity() - d.freeSpaceAtBegin()) {
        if (d->flags() & Data::CapacityReserved)
            return;  // already reserved, don't shrink
        if (!d->isShared()) {
            // accept current allocation, don't shrink
            d->setFlag(Data::CapacityReserved);
            return;
        }
    }

    DataPointer detached(qMax(asize, size()));
    detached->copyAppend(d->begin(), d->end());
    if (detached.d_ptr())
        detached->setFlag(Data::CapacityReserved);
    d.swap(detached);
}